

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.hpp
# Opt level: O2

AuthFields * __thiscall
arbiter::drivers::AZ::Config::authFields(AuthFields *__return_storage_ptr__,Config *this)

{
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)&this->m_storageAccount);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&this->m_storageAccessKey);
  AuthFields::AuthFields(__return_storage_ptr__,&local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

AuthFields authFields() const { return AuthFields(m_storageAccount, m_storageAccessKey); }